

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::HeapArgumentsObject::SetPropertyWithAttributes
          (HeapArgumentsObject *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  BOOL BVar1;
  ES5HeapArgumentsObject *this_00;
  uint32 local_40;
  PropertyOperationFlags local_3c;
  uint32 index;
  PropertyOperationFlags flags_local;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyAttributes attributes_local;
  Var value_local;
  HeapArgumentsObject *pHStack_18;
  PropertyId propertyId_local;
  HeapArgumentsObject *this_local;
  
  local_3c = flags;
  _index = info;
  info_local._7_1_ = attributes;
  pvStack_28 = value;
  value_local._4_4_ = propertyId;
  pHStack_18 = this;
  BVar1 = IsFormalArgument(this,propertyId,&local_40);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DynamicObject::SetPropertyWithAttributes
                   ((DynamicObject *)this,value_local._4_4_,pvStack_28,info_local._7_1_,_index,
                    local_3c,possibleSideEffects);
  }
  else {
    this_00 = ConvertToES5HeapArgumentsObject(this,true);
    this_local._4_4_ =
         ES5HeapArgumentsObject::SetPropertyWithAttributesForFormal
                   (this_00,local_40,value_local._4_4_,pvStack_28,info_local._7_1_,_index,local_3c,
                    possibleSideEffects);
  }
  return this_local._4_4_;
}

Assistant:

BOOL HeapArgumentsObject::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        // This is called by defineProperty in order to change the value in objectArray.
        // We have to intercept this call because
        // in case when we are connected (objectArray item is not used) we need to update the slot value (which is actually used).
        uint32 index;
        if (this->IsFormalArgument(propertyId, &index))
        {
            return this->ConvertToES5HeapArgumentsObject()->SetPropertyWithAttributesForFormal(
                index, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }